

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::RenderStairs<ImPlot::GetterXsYs<short>,ImPlot::TransformerLinLog>
               (GetterXsYs<short> *getter,TransformerLinLog *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  long lVar1;
  bool bVar2;
  StairsRenderer<ImPlot::GetterXsYs<short>,_ImPlot::TransformerLinLog> local_b8;
  ImVec2 local_90;
  ImVec2 p12;
  ImVec2 local_80;
  ImRect local_78;
  ImPlotPoint local_68;
  ImVec2 local_54;
  ImVec2 p2;
  int i;
  ImVec2 local_38;
  ImVec2 p1;
  ImPlotContext *gp;
  ImU32 col_local;
  float line_weight_local;
  ImDrawList *DrawList_local;
  TransformerLinLog *transformer_local;
  GetterXsYs<short> *getter_local;
  
  p1 = (ImVec2)GImPlot;
  bVar2 = ImHasFlag<int,ImPlotFlags_>(GImPlot->CurrentPlot->Flags,ImPlotFlags_AntiAliased);
  if ((bVar2) || ((*(byte *)((long)p1 + 0x448) & 1) != 0)) {
    join_0x00001240_0x00001200_ = GetterXsYs<short>::operator()(getter,0);
    local_38 = TransformerLinLog::operator()(transformer,(ImPlotPoint *)&p2.y);
    for (p2.x = 1.4013e-45; (int)p2.x < getter->Count; p2.x = (float)((int)p2.x + 1)) {
      local_68 = GetterXsYs<short>::operator()(getter,(int)p2.x);
      local_54 = TransformerLinLog::operator()(transformer,&local_68);
      lVar1 = *(long *)((long)p1 + 0x28);
      local_80 = ImMin(&local_38,&local_54);
      p12 = ImMax(&local_38,&local_54);
      ImRect::ImRect(&local_78,&local_80,&p12);
      bVar2 = ImRect::Overlaps((ImRect *)(lVar1 + 0x2b8),&local_78);
      if (bVar2) {
        ImVec2::ImVec2(&local_90,local_54.x,local_38.y);
        ImDrawList::AddLine(DrawList,&local_38,&local_90,col,line_weight);
        ImDrawList::AddLine(DrawList,&local_90,&local_54,col,line_weight);
      }
      local_38 = local_54;
    }
  }
  else {
    StairsRenderer<ImPlot::GetterXsYs<short>,_ImPlot::TransformerLinLog>::StairsRenderer
              (&local_b8,getter,transformer,col,line_weight);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterXsYs<short>,ImPlot::TransformerLinLog>>
              (&local_b8,DrawList,(ImRect *)(*(long *)((long)p1 + 0x28) + 0x2b8));
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}